

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_val_anchors_and_refs(Parser *this)

{
  Tree *pTVar1;
  ulong uVar2;
  NodeType_e NVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  csubstr s;
  csubstr s_00;
  char *pcVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  size_t sVar11;
  long lVar12;
  csubstr rem;
  char msg [31];
  basic_substring<const_char> local_98;
  basic_substring<const_char> local_88;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if ((this->m_state->flags & 0x40) != 0) {
    uStack_78 = 0x5f736168;
    uStack_74 = 0x28796e61;
    uStack_70 = 0x59454b52;
    uStack_6c = CONCAT13(uStack_6c._3_1_,0x2929);
    local_88.str = (char *)0x6166206b63656863;
    local_88.len._0_4_ = 0x64656c69;
    local_88.len._4_4_ = 0x2128203a;
    if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      uVar9 = (*pcVar4)();
      return (bool)uVar9;
    }
    local_58 = 0;
    uStack_50 = 0x71a6;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x71a6) << 0x40);
    LVar5.name.str._0_4_ = 0x1fbeda;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_88,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  local_98.str = (this->m_state->line_contents).rem.str;
  local_98.len = (this->m_state->line_contents).rem.len;
  if (local_98.len == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = *local_98.str == '&';
  }
  if (bVar8 == false) {
    if (local_98.len == 0) {
      return bVar8;
    }
    if (*local_98.str != '*') {
      return bVar8;
    }
    _handle_val_anchors_and_refs(this);
LAB_001d9f82:
    local_88.str = local_98.str;
    local_88.len._0_4_ = (undefined4)local_98.len;
    local_88.len._4_4_ = (undefined4)(local_98.len >> 0x20);
  }
  else {
    sVar11 = basic_substring<const_char>::first_of(&local_98,' ',0);
    if ((sVar11 != 0xffffffffffffffff) && (local_98.len < sVar11)) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar4 = (code *)swi(3);
        uVar9 = (*pcVar4)();
        return (bool)uVar9;
      }
      handle_error(0x1fbf87,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar11 == 0xffffffffffffffff) goto LAB_001d9f82;
    basic_substring<const_char>::basic_substring(&local_88,local_98.str,sVar11);
  }
  pcVar7 = local_88.str;
  sVar11 = CONCAT44(local_88.len._4_4_,(undefined4)local_88.len);
  _line_progressed(this,sVar11);
  if (sVar11 == 0) {
    if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      uVar9 = (*pcVar4)();
      return (bool)uVar9;
    }
    handle_error(0x1fbf87,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring(&local_88,pcVar7 + 1,sVar11 - 1);
  pcVar7 = local_88.str;
  sVar11 = CONCAT44(local_88.len._4_4_,(undefined4)local_88.len);
  if (((this->m_val_anchor).len == 0) || ((this->m_val_anchor).str == (char *)0x0)) {
LAB_001da1b5:
    (this->m_val_anchor).str = pcVar7;
    (this->m_val_anchor).len = sVar11;
    s_00.len = local_98.len;
    s_00.str = local_98.str;
    sVar11 = LineContents::current_col(&this->m_state->line_contents,s_00);
    lVar12 = 0xa60;
  }
  else {
    pTVar1 = this->m_tree;
    uVar2 = this->m_state->node_id;
    if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
      if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        uVar9 = (*pcVar4)();
        return (bool)uVar9;
      }
      local_88.str = (char *)0x0;
      local_88.len._0_4_ = 0x4b86;
      local_88.len._4_4_ = 0;
      uStack_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0x1fbeda;
      uStack_6c = 0;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[uVar2].m_type.type & SEQ) == NOTYPE) {
      return bVar8;
    }
    bVar10 = Tree::has_children(this->m_tree,this->m_state->node_id);
    if (!bVar10) {
      pTVar1 = this->m_tree;
      uVar2 = this->m_state->node_id;
      if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          uVar9 = (*pcVar4)();
          return (bool)uVar9;
        }
        local_88.str = (char *)0x0;
        local_88.len._0_4_ = 0x4b86;
        local_88.len._4_4_ = 0;
        uStack_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0x1fbeda;
        uStack_6c = 0;
        local_68 = 0x65;
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      NVar3 = pTVar1->m_buf[uVar2].m_type.type;
      if ((NVar3 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar3 >> 9 & 1) == 0) {
        Tree::set_val_anchor(this->m_tree,this->m_state->node_id,this->m_val_anchor);
        goto LAB_001da1b5;
      }
    }
    (this->m_key_anchor).str = pcVar7;
    (this->m_key_anchor).len = sVar11;
    s.len = local_98.len;
    s.str = local_98.str;
    sVar11 = LineContents::current_col(&this->m_state->line_contents,s);
    lVar12 = 0xa48;
  }
  *(size_t *)((long)(this->m_stack).m_buf + lVar12 + -0x38) = sVar11;
  return bVar8;
}

Assistant:

bool Parser::_handle_val_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RKEY));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _c4dbgpf("val: found an anchor: '{}', indentation={}!!!", anchor, m_state->line_contents.current_col(rem));
        if(m_val_anchor.empty())
        {
            _c4dbgpf("save val anchor: '{}'", anchor);
            m_val_anchor = anchor;
            m_val_anchor_indentation = m_state->line_contents.current_col(rem);
        }
        else
        {
            _c4dbgpf("there is a pending val anchor '{}'", m_val_anchor);
            if(m_tree->is_seq(m_state->node_id))
            {
                if(m_tree->has_children(m_state->node_id))
                {
                    _c4dbgpf("current node={} is a seq, has {} children", m_state->node_id, m_tree->num_children(m_state->node_id));
                    _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                    m_key_anchor = anchor;
                    m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                }
                else
                {
                    _c4dbgpf("current node={} is a seq, has no children", m_state->node_id);
                    if(m_tree->has_val_anchor(m_state->node_id))
                    {
                        _c4dbgpf("... node={} already has val anchor: '{}'", m_state->node_id, m_tree->val_anchor(m_state->node_id));
                        _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                        m_key_anchor = anchor;
                        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                    else
                    {
                        _c4dbgpf("... so set pending val anchor: '{}' on current node {}", m_val_anchor, m_state->node_id);
                        m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                        m_val_anchor = anchor;
                        m_val_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                }
            }
        }
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}